

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2CBus.h
# Opt level: O0

int SetOptionsI2CBus(I2CBUS *pI2CBus,UINT usbissoperatingmode,UINT BaudRate,UINT timeout)

{
  int iVar1;
  uint8 usbissbaudratedivlow;
  uint8 usbissbaudratedivhigh;
  UINT usbissbaudrate;
  UINT usbissreadbuflen;
  uint8 usbissreadbuf [2];
  UINT usbisswritebuflen;
  uint8 usbisswritebuf [6];
  UINT timeout_local;
  UINT BaudRate_local;
  UINT usbissoperatingmode_local;
  I2CBUS *pI2CBus_local;
  
  usbissreadbuflen = 0;
  pI2CBus->BaudRate = BaudRate;
  if (pI2CBus->DevType != 0) {
    if (pI2CBus->DevType != 1) {
      return 1;
    }
    iVar1 = SetOptionsComputerRS232Port
                      (pI2CBus->hDev,BaudRate,pI2CBus->ParityMode,pI2CBus->bCheckParity,
                       pI2CBus->nbDataBits,pI2CBus->StopBitsMode,timeout);
    if (iVar1 != 0) {
      return 1;
    }
    usbissreadbuf[0] = 'Z';
    usbissreadbuf[1] = '\x02';
    usbissreadbuflen = 5;
    iVar1 = WriteAllRS232Port(&pI2CBus->RS232Port,usbissreadbuf,5);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = ReadAllRS232Port(&pI2CBus->RS232Port,(uint8 *)((long)&usbissbaudrate + 2),2);
    if (iVar1 != 0) {
      return 1;
    }
    if ((usbissbaudrate._2_1_ != -1) || (usbissbaudrate._3_1_ != '\0')) {
      return 1;
    }
  }
  return 0;
}

Assistant:

inline int SetOptionsI2CBus(I2CBUS* pI2CBus, UINT usbissoperatingmode, UINT BaudRate, UINT timeout)
{
	uint8 usbisswritebuf[6];
	UINT usbisswritebuflen = 0;
	uint8 usbissreadbuf[2];
	UINT usbissreadbuflen = 2;
	UINT usbissbaudrate = (48000000/(16+BaudRate))-1;
	uint8 usbissbaudratedivhigh = (uint8)(usbissbaudrate >> 8);
	uint8 usbissbaudratedivlow = (uint8)usbissbaudrate;

	pI2CBus->BaudRate = BaudRate;

	switch (pI2CBus->DevType)
	{
	case USBISS_TYPE_I2CBUS:
		if (SetOptionsComputerRS232Port(pI2CBus->hDev, BaudRate, pI2CBus->ParityMode, pI2CBus->bCheckParity, pI2CBus->nbDataBits, pI2CBus->StopBitsMode, timeout) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_I2CBUS(("SetOptionsI2CBus error (%s) : %s"
				"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n", 
				strtime_m(), 
				"SetOptionsComputerRS232Port failed. ", 
				pI2CBus, usbissoperatingmode, BaudRate, timeout));
			return EXIT_FAILURE;
		}
		usbisswritebuf[0] = (uint8)0x5A; // USB-ISS setup.
		usbisswritebuf[1] = (uint8)0x02; // ISS_MODE.
		usbisswritebuf[2] = (uint8)usbissoperatingmode;
		usbisswritebuf[3] = (uint8)usbissbaudratedivhigh;
		usbisswritebuf[4] = (uint8)usbissbaudratedivlow;
		usbisswritebuflen = 5;
		if (WriteAllRS232Port(&pI2CBus->RS232Port, usbisswritebuf, usbisswritebuflen) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_I2CBUS(("SetOptionsI2CBus error (%s) : %s",
				"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n",
				strtime_m(),
				"WriteAllRS232Port failed. ",
				pI2CBus, usbissoperatingmode, BaudRate, timeout));
			return EXIT_FAILURE;
		}
		if (ReadAllRS232Port(&pI2CBus->RS232Port, usbissreadbuf, usbissreadbuflen) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_I2CBUS(("SetOptionsI2CBus error (%s) : %s",
				"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n",
				strtime_m(),
				"ReadAllRS232Port failed. ",
				pI2CBus, usbissoperatingmode, BaudRate, timeout));
			return EXIT_FAILURE;
		}
		if ((usbissreadbuf[0] != 0xFF)||(usbissreadbuf[1] != 0x00))
		{
			PRINT_DEBUG_WARNING_I2CBUS(("SetOptionsI2CBus error (%s) : %s",
				"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n",
				strtime_m(),
				"USB-ISS error. ",
				pI2CBus, usbissoperatingmode, BaudRate, timeout));
			return EXIT_FAILURE;
		}
		break;
	case LOCAL_TYPE_I2CBUS:
		PRINT_DEBUG_WARNING_I2CBUS(("SetOptionsI2CBus warning (%s) : %s"
			"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n", 
			strtime_m(), 
			"Please check the specific configuration of the computer. ", 
			pI2CBus, usbissoperatingmode, BaudRate, timeout));
		break;
	default:
		PRINT_DEBUG_ERROR_I2CBUS(("SetOptionsI2CBus error (%s) : %s"
			"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pI2CBus, usbissoperatingmode, BaudRate, timeout));
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}